

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5DecodeDoclist(int *pRc,Fts5Buffer *pBuf,u8 *a,int n)

{
  int iVar1;
  u8 *puVar2;
  byte bVar3;
  int in_EAX;
  int extraout_EAX;
  int iVar4;
  int extraout_EAX_00;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  i64 iDelta;
  undefined8 local_58;
  u64 local_50;
  int local_44;
  u8 *local_40;
  u64 local_38;
  
  local_38 = 0;
  local_40 = a;
  if (n < 1) {
    local_50 = 0;
    uVar5 = 0;
  }
  else {
    bVar3 = sqlite3Fts5GetVarint(a,&local_38);
    uVar5 = (uint)bVar3;
    local_50 = local_38;
    sqlite3Fts5BufferAppendPrintf(pRc,pBuf," id=%lld");
    in_EAX = extraout_EAX;
  }
  puVar2 = local_40;
  local_44 = n;
  if ((int)uVar5 < n) {
    do {
      local_58._0_4_ = (uint)puVar2[(int)uVar5];
      iVar4 = 1;
      if ((char)puVar2[(int)uVar5] < '\0') {
        iVar4 = sqlite3Fts5GetVarint32(puVar2 + (int)uVar5,(u32 *)&local_58);
      }
      uVar7 = (int)(uint)local_58 / 2;
      iVar4 = iVar4 + uVar5;
      pcVar6 = "*";
      if (((uint)local_58 & 1) == 0) {
        pcVar6 = "";
      }
      sqlite3Fts5BufferAppendPrintf(pRc,pBuf," nPos=%d%s",(ulong)uVar7,pcVar6);
      iVar1 = local_44;
      uVar5 = local_44 - iVar4;
      if ((int)uVar7 <= local_44 - iVar4) {
        uVar5 = uVar7;
      }
      in_EAX = fts5DecodePoslist(pRc,pBuf,puVar2 + iVar4,uVar5);
      uVar5 = in_EAX + iVar4;
      if ((int)uVar5 < iVar1) {
        bVar3 = sqlite3Fts5GetVarint(puVar2 + (int)uVar5,&local_58);
        uVar5 = uVar5 + bVar3;
        local_50 = local_50 + CONCAT44(local_58._4_4_,(uint)local_58);
        sqlite3Fts5BufferAppendPrintf(pRc,pBuf," id=%lld");
        in_EAX = extraout_EAX_00;
      }
    } while ((int)uVar5 < iVar1);
  }
  return in_EAX;
}

Assistant:

static int fts5DecodeDoclist(int *pRc, Fts5Buffer *pBuf, const u8 *a, int n){
  i64 iDocid = 0;
  int iOff = 0;

  if( n>0 ){
    iOff = sqlite3Fts5GetVarint(a, (u64*)&iDocid);
    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " id=%lld", iDocid);
  }
  while( iOff<n ){
    int nPos;
    int bDel;
    iOff += fts5GetPoslistSize(&a[iOff], &nPos, &bDel);
    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " nPos=%d%s", nPos, bDel?"*":"");
    iOff += fts5DecodePoslist(pRc, pBuf, &a[iOff], MIN(n-iOff, nPos));
    if( iOff<n ){
      i64 iDelta;
      iOff += sqlite3Fts5GetVarint(&a[iOff], (u64*)&iDelta);
      iDocid += iDelta;
      sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " id=%lld", iDocid);
    }
  }

  return iOff;
}